

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumCheckerboardTexture::Evaluate
          (SpectrumCheckerboardTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar8 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  SampledSpectrum SVar16;
  DispatchSplit<12> local_d1;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  local_d0;
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  TaggedPointer<pbrt::TransformMapping3D> local_88;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_80;
  Tuple3<pbrt::Point3,_float> local_78 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_60 [4];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  
  local_80.bits =
       (this->map2D).
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       .bits;
  local_88.bits = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  auVar3._0_8_ = Checkerboard(this->aaMethod,ctx,(TextureMapping2DHandle *)&local_80,
                              (TextureMapping3DHandle *)&local_88);
  auVar3._8_56_ = extraout_var;
  local_c8 = auVar3._0_16_;
  if ((auVar3._0_4_ != 0.0) || (NAN(auVar3._0_4_))) {
    auVar1 = vmovshdup_avx(local_c8);
    if ((auVar1._0_4_ != 0.0) || (NAN(auVar1._0_4_))) {
      local_78[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_78[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_78[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_78[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_78[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_78[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_60[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_60[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_60[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_60[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_60[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_60[1].z = ctx.dudx;
      aTStack_60[2].x = ctx.dudy;
      aTStack_60[2].y = ctx.dvdx;
      aTStack_60[2].z = ctx.dvdy;
      aTStack_60[3].x = (float)ctx.faceIndex;
      local_a8[0] = lambda.lambda.values[0];
      local_a8[1] = lambda.lambda.values[1];
      afStack_a0[0] = lambda.lambda.values[2];
      afStack_a0[1] = lambda.lambda.values[3];
      afStack_98[0] = lambda.pdf.values[0];
      afStack_98[1] = lambda.pdf.values[1];
      afStack_90[0] = lambda.pdf.values[2];
      afStack_90[1] = lambda.pdf.values[3];
      local_d0.bits =
           this->tex[0].
           super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
           .bits;
      auVar8 = ZEXT856((ulong)lambda.lambda.values._8_8_);
      auVar15 = ZEXT856(auVar1._8_8_);
      SVar16 = detail::DispatchSplit<12>::operator()
                         (&local_d1,local_78,local_a8,&local_d0,local_d0.bits >> 0x30);
      auVar13._0_8_ = SVar16.values.values._8_8_;
      auVar13._8_56_ = auVar15;
      auVar6._0_8_ = SVar16.values.values._0_8_;
      auVar6._8_56_ = auVar8;
      auVar1 = vmovlhps_avx(auVar6._0_16_,auVar13._0_16_);
      auVar10._4_4_ = local_c8._0_4_;
      auVar10._0_4_ = local_c8._0_4_;
      auVar10._8_4_ = local_c8._0_4_;
      auVar10._12_4_ = local_c8._0_4_;
      local_b8 = (float)local_c8._0_4_ * auVar1._0_4_;
      fStack_b4 = (float)local_c8._0_4_ * auVar1._4_4_;
      fStack_b0 = (float)local_c8._0_4_ * auVar1._8_4_;
      fStack_ac = (float)local_c8._0_4_ * auVar1._12_4_;
      local_78[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_78[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_78[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_78[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_78[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_78[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_60[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_60[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_60[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_60[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_60[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_60[1].z = ctx.dudx;
      aTStack_60[2].x = ctx.dudy;
      aTStack_60[2].y = ctx.dvdx;
      aTStack_60[2].z = ctx.dvdy;
      aTStack_60[3].x = (float)ctx.faceIndex;
      local_a8[0] = lambda.lambda.values[0];
      local_a8[1] = lambda.lambda.values[1];
      afStack_a0[0] = lambda.lambda.values[2];
      afStack_a0[1] = lambda.lambda.values[3];
      afStack_98[0] = lambda.pdf.values[0];
      afStack_98[1] = lambda.pdf.values[1];
      afStack_90[0] = lambda.pdf.values[2];
      afStack_90[1] = lambda.pdf.values[3];
      local_d0.bits =
           this->tex[1].
           super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
           .bits;
      auVar8 = ZEXT856((ulong)lambda.lambda.values._8_8_);
      auVar15 = ZEXT856(auVar10._8_8_);
      SVar16 = detail::DispatchSplit<12>::operator()
                         (&local_d1,local_78,local_a8,&local_d0,local_d0.bits >> 0x30);
      auVar14._0_8_ = SVar16.values.values._8_8_;
      auVar14._8_56_ = auVar15;
      auVar7._0_8_ = SVar16.values.values._0_8_;
      auVar7._8_56_ = auVar8;
      auVar1 = vmovlhps_avx(auVar7._0_16_,auVar14._0_16_);
      auVar10 = vpermilps_avx(local_c8,0x55);
      auVar2._0_4_ = auVar10._0_4_ * auVar1._0_4_ + local_b8;
      auVar2._4_4_ = auVar10._4_4_ * auVar1._4_4_ + fStack_b4;
      auVar2._8_4_ = auVar10._8_4_ * auVar1._8_4_ + fStack_b0;
      auVar2._12_4_ = auVar10._12_4_ * auVar1._12_4_ + fStack_ac;
      goto LAB_003af0f3;
    }
    local_78[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_78[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_78[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_78[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_78[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_78[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_60[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_60[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_60[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_60[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_60[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_60[1].z = ctx.dudx;
    aTStack_60[2].x = ctx.dudy;
    aTStack_60[2].y = ctx.dvdx;
    aTStack_60[2].z = ctx.dvdy;
    aTStack_60[3].x = (float)ctx.faceIndex;
    local_a8[0] = lambda.lambda.values[0];
    local_a8[1] = lambda.lambda.values[1];
    afStack_a0[0] = lambda.lambda.values[2];
    afStack_a0[1] = lambda.lambda.values[3];
    afStack_98[0] = lambda.pdf.values[0];
    afStack_98[1] = lambda.pdf.values[1];
    afStack_90[0] = lambda.pdf.values[2];
    afStack_90[1] = lambda.pdf.values[3];
    local_d0.bits =
         this->tex[0].
         super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
         .bits;
    auVar8 = ZEXT856((ulong)lambda.lambda.values._8_8_);
    auVar15 = ZEXT856(auVar1._8_8_);
    SVar16 = detail::DispatchSplit<12>::operator()(&local_d1);
    auVar12._0_8_ = SVar16.values.values._8_8_;
    auVar12._8_56_ = auVar15;
    auVar5._0_8_ = SVar16.values.values._0_8_;
    auVar5._8_56_ = auVar8;
    auVar1 = vmovlhps_avx(auVar5._0_16_,auVar12._0_16_);
    auVar9._4_4_ = local_c8._0_4_;
    auVar9._0_4_ = local_c8._0_4_;
    auVar9._8_4_ = local_c8._0_4_;
    auVar9._12_4_ = local_c8._0_4_;
  }
  else {
    local_78[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_78[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_78[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_78[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_78[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_78[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_60[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_60[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_60[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_60[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_60[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_60[1].z = ctx.dudx;
    aTStack_60[2].x = ctx.dudy;
    aTStack_60[2].y = ctx.dvdx;
    aTStack_60[2].z = ctx.dvdy;
    aTStack_60[3].x = (float)ctx.faceIndex;
    local_a8[0] = lambda.lambda.values[0];
    local_a8[1] = lambda.lambda.values[1];
    afStack_a0[0] = lambda.lambda.values[2];
    afStack_a0[1] = lambda.lambda.values[3];
    afStack_98[0] = lambda.pdf.values[0];
    afStack_98[1] = lambda.pdf.values[1];
    afStack_90[0] = lambda.pdf.values[2];
    afStack_90[1] = lambda.pdf.values[3];
    local_d0.bits =
         this->tex[1].
         super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
         .bits;
    auVar8 = ZEXT856(extraout_var._0_8_);
    auVar15 = ZEXT856((ulong)lambda.lambda.values._8_8_);
    SVar16 = detail::DispatchSplit<12>::operator()(&local_d1);
    auVar11._0_8_ = SVar16.values.values._8_8_;
    auVar11._8_56_ = auVar15;
    auVar4._0_8_ = SVar16.values.values._0_8_;
    auVar4._8_56_ = auVar8;
    auVar1 = vmovlhps_avx(auVar4._0_16_,auVar11._0_16_);
    auVar9 = vpermilps_avx(local_c8,0x55);
  }
  auVar2._0_4_ = auVar9._0_4_ * auVar1._0_4_;
  auVar2._4_4_ = auVar9._4_4_ * auVar1._4_4_;
  auVar2._8_4_ = auVar9._8_4_ * auVar1._8_4_;
  auVar2._12_4_ = auVar9._12_4_ * auVar1._12_4_;
LAB_003af0f3:
  auVar1 = vshufpd_avx(auVar2,auVar2,1);
  SVar16.values.values._0_8_ = auVar2._0_8_;
  SVar16.values.values._8_8_ = auVar1._0_8_;
  return (SampledSpectrum)SVar16.values.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        pstd::array<Float, 2> wt = Checkerboard(aaMethod, ctx, map2D, map3D);
        if (wt[0] == 0)
            return wt[1] * tex[1].Evaluate(ctx, lambda);
        else if (wt[1] == 0)
            return wt[0] * tex[0].Evaluate(ctx, lambda);
        else
            return wt[0] * tex[0].Evaluate(ctx, lambda) +
                   wt[1] * tex[1].Evaluate(ctx, lambda);
    }